

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

string * __thiscall
spvtools::opt::analysis::RuntimeArray::str_abi_cxx11_
          (string *__return_storage_ptr__,RuntimeArray *this)

{
  ostream *poVar1;
  ostringstream oss;
  long *local_1b0;
  long local_1a8;
  long local_1a0 [2];
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"[",1);
  (*this->element_type_->_vptr_Type[3])(&local_1b0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(char *)local_1b0,local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string RuntimeArray::str() const {
  std::ostringstream oss;
  oss << "[" << element_type_->str() << "]";
  return oss.str();
}